

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_semaphore_wrapper.hpp
# Opt level: O0

void __thiscall
oqpi::posix_semaphore_wrapper::posix_semaphore_wrapper
          (posix_semaphore_wrapper *this,string *name,sync_object_creation_options creationOption,
          int32_t initCount)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  bool isLocalSyncObject;
  allocator<char> local_21;
  uint32_t local_20;
  sync_object_creation_options local_1c;
  int32_t initCount_local;
  sync_object_creation_options creationOption_local;
  string *name_local;
  posix_semaphore_wrapper *this_local;
  
  this->handle_ = (sem_t *)0x0;
  local_20 = initCount;
  local_1c = creationOption;
  _initCount_local = name;
  name_local = (string *)this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+(&this->name_,"/",_initCount_local);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&this->name_,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 & 1) == 0) || (local_1c == open_existing)) {
    bVar2 = initGlobalSemaphore(this,local_1c,local_20);
    if (!bVar2) {
      release(this);
    }
  }
  else {
    bVar2 = initLocalSemaphore(this,local_1c,local_20);
    if (!bVar2) {
      release(this);
    }
  }
  return;
}

Assistant:

posix_semaphore_wrapper(const std::string &name, sync_object_creation_options creationOption, int32_t initCount)
            : handle_(nullptr)
            , name_(name.empty() ? "" : "/" + name)
        {
            const auto isLocalSyncObject = name_.empty();
            if (isLocalSyncObject && creationOption != sync_object_creation_options::open_existing)
            {
                if (!initLocalSemaphore(creationOption, initCount))
                {
                    release();
                }
            }
            else
            {
                if (!initGlobalSemaphore(creationOption, initCount))
                {
                    release();
                }
            }
        }